

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O0

void __thiscall TGAImage::flip_horizontally(TGAImage *this)

{
  uint uVar1;
  TGAColor TVar2;
  size_type sVar3;
  TGAColor local_32;
  undefined1 auStack_2d [3];
  TGAColor c2;
  TGAColor c1;
  size_t j;
  size_t i;
  size_t half;
  TGAImage *this_local;
  
  sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
  if (sVar3 != 0) {
    uVar1 = this->width;
    for (j = 0; j < uVar1 >> 1; j = j + 1) {
      for (stack0xffffffffffffffd8 = 0; stack0xffffffffffffffd8 < this->height;
          register0x00000000 = stack0xffffffffffffffd8 + 1) {
        TVar2 = get(this,j,stack0xffffffffffffffd8);
        _auStack_2d = TVar2.bgra;
        c2.bgra[1] = TVar2.bytespp;
        TVar2 = get(this,(this->width - 1) - j,stack0xffffffffffffffd8);
        local_32.bgra = TVar2.bgra;
        local_32.bytespp = TVar2.bytespp;
        set(this,j,stack0xffffffffffffffd8,&local_32);
        set(this,(this->width - 1) - j,stack0xffffffffffffffd8,(TGAColor *)auStack_2d);
      }
    }
  }
  return;
}

Assistant:

void TGAImage::flip_horizontally()
{
    if (!data.size()) return;
    size_t half = width >> 1;
    for (size_t i = 0; i < half; i++) {
        for (size_t j = 0; j < height; j++) {
            TGAColor c1 = get(i, j);
            TGAColor c2 = get(width - 1 - i, j);
            set(i, j, c2);
            set(width - 1 - i, j, c1);
        }
    }
}